

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::print_payload_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,PayloadList *payload,uint32_t indent)

{
  uint uVar1;
  ostream *poVar2;
  uint32_t n;
  ListEditQual extraout_EDX;
  ListEditQual extraout_EDX_00;
  ListEditQual v;
  type vars;
  stringstream ss;
  vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> local_1e8;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  uVar1 = *(uint *)this;
  std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::vector
            (&local_1e8,(vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)(this + 8))
  ;
  pprint::Indent_abi_cxx11_(&local_1d0,(pprint *)((ulong)payload & 0xffffffff),n);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  v = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    v = extraout_EDX_00;
  }
  if (uVar1 != 0) {
    to_string_abi_cxx11_(&local_1d0,(tinyusdz *)(ulong)uVar1,v);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"payload = ",10);
  if (local_1e8.super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_1e8.super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"None",4);
  }
  else if ((long)local_1e8.super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_1e8.super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>
                 ._M_impl.super__Vector_impl_data._M_start == 0x120) {
    ::std::operator<<(local_1a0,
                      local_1e8.
                      super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    ::std::operator<<(local_1a0,
                      (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)&local_1e8);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\n",1);
  ::std::__cxx11::stringbuf::str();
  ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector
            ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)&local_1e8);
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  ::std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string print_payload(const prim::PayloadList &payload,
                          const uint32_t indent) {
  std::stringstream ss;

  auto listEditQual = std::get<0>(payload);
  auto vars = std::get<1>(payload);

  ss << pprint::Indent(indent);

  if (listEditQual != ListEditQual::ResetToExplicit) {
    ss << to_string(listEditQual) << " ";
  }

  ss << "payload = ";
  if (vars.empty()) {
    ss << "None";
  } else {
    if (vars.size() == 1) {
      ss << vars[0];
    } else {
      ss << vars;
    }
  }
  ss << "\n";

  return ss.str();
}